

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestRunTest.cxx
# Opt level: O1

bool __thiscall
cmCTestRunTest::ForkProcess
          (cmCTestRunTest *this,cmDuration testTimeOut,bool explicitTimeout,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *environment,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *environment_modification,vector<unsigned_long,_std::allocator<unsigned_long>_> *affinity)

{
  cmProcess *this_00;
  cmCTest *this_01;
  pointer pbVar1;
  size_type sVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  bool bVar4;
  ostream *poVar5;
  size_type sVar6;
  byte bVar7;
  iterator __end2;
  undefined1 auVar8 [8];
  iterator __begin2;
  pointer envmod;
  cmDuration cVar9;
  cmDuration timeout;
  EnvDiff diff;
  SaveRestoreEnvironment sre;
  ostringstream envMeasurement;
  cmDuration local_200;
  undefined1 local_1f8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbStack_1f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e8;
  rep_conflict local_1c8;
  SaveRestoreEnvironment local_1c0;
  undefined1 local_1a8 [376];
  
  this_00 = (this->TestProcess)._M_t.
            super___uniq_ptr_impl<cmProcess,_std::default_delete<cmProcess>_>._M_t.
            super__Tuple_impl<0UL,_cmProcess_*,_std::default_delete<cmProcess>_>.
            super__Head_base<0UL,_cmProcess_*,_false>._M_head_impl;
  this_00->Id = this->Index;
  local_1c8 = testTimeOut.__r;
  cmProcess::SetWorkingDirectory(this_00,&this->TestProperties->Directory);
  cmProcess::SetCommand
            ((this->TestProcess)._M_t.
             super___uniq_ptr_impl<cmProcess,_std::default_delete<cmProcess>_>._M_t.
             super__Tuple_impl<0UL,_cmProcess_*,_std::default_delete<cmProcess>_>.
             super__Head_base<0UL,_cmProcess_*,_false>._M_head_impl,&this->ActualCommand);
  cmProcess::SetCommandArguments
            ((this->TestProcess)._M_t.
             super___uniq_ptr_impl<cmProcess,_std::default_delete<cmProcess>_>._M_t.
             super__Tuple_impl<0UL,_cmProcess_*,_std::default_delete<cmProcess>_>.
             super__Head_base<0UL,_cmProcess_*,_false>._M_head_impl,&this->Arguments);
  local_200 = cmCTest::GetRemainingTimeAllowed(this->CTest);
  cVar9 = cmCTest::MaxDuration();
  if ((local_200.__r != cVar9.__r) || (NAN(local_200.__r) || NAN(cVar9.__r))) {
    local_200.__r = local_200.__r + -120.0;
  }
  cVar9 = cmCTest::GetTimeOut(this->CTest);
  if (0.0 < cVar9.__r) {
    cVar9 = cmCTest::GetTimeOut(this->CTest);
    if (cVar9.__r < local_200.__r) {
      local_200 = cmCTest::GetTimeOut(this->CTest);
    }
  }
  if (0.0 < local_1c8) {
    cVar9 = cmCTest::GetRemainingTimeAllowed(this->CTest);
    if (local_1c8 < cVar9.__r) {
      local_200.__r = local_1c8;
    }
  }
  if (local_200.__r <= 0.0) {
    local_200.__r = 1.0;
  }
  if (explicitTimeout && local_1c8 == 0.0) {
    local_200.__r = 0.0;
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  poVar5 = (ostream *)std::ostream::operator<<((ostringstream *)local_1a8,this->Index);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,": ",2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"Test timeout computed to be: ",0x1d);
  cmDurationTo<unsigned_int>(&local_200);
  poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
  this_01 = this->CTest;
  std::__cxx11::stringbuf::str();
  cmCTest::Log(this_01,5,
               "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestRunTest.cxx"
               ,0x30e,(char *)local_1f8,(this->TestHandler->super_cmCTestGenericHandler).Quiet);
  if (local_1f8 != (undefined1  [8])&local_1e8) {
    operator_delete((void *)local_1f8,(ulong)(local_1e8._M_dataplus._M_p + 1));
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
  (((this->TestProcess)._M_t.super___uniq_ptr_impl<cmProcess,_std::default_delete<cmProcess>_>._M_t.
    super__Tuple_impl<0UL,_cmProcess_*,_std::default_delete<cmProcess>_>.
    super__Head_base<0UL,_cmProcess_*,_false>._M_head_impl)->Timeout).__r = local_200.__r;
  cmSystemTools::SaveRestoreEnvironment::SaveRestoreEnvironment(&local_1c0);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  if ((environment !=
       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        *)0x0) &&
     ((environment->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_start !=
      (environment->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish)) {
    local_1e8._M_string_length = (size_type)&pbStack_1f0;
    pbStack_1f0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  ((ulong)pbStack_1f0 & 0xffffffff00000000);
    local_1e8._M_dataplus._M_p = (pointer)0x0;
    local_1e8.field_2._8_8_ = 0;
    local_1e8.field_2._M_allocated_capacity = local_1e8._M_string_length;
    cmSystemTools::EnvDiff::AppendEnv((EnvDiff *)local_1f8,environment);
    cmSystemTools::EnvDiff::ApplyToCurrentEnv((EnvDiff *)local_1f8,(ostringstream *)local_1a8);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                 *)local_1f8);
  }
  if (environment_modification !=
      (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       *)0x0) {
    envmod = (environment_modification->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    pbVar1 = (environment_modification->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    if (envmod != pbVar1) {
      local_1e8._M_string_length = (size_type)&pbStack_1f0;
      pbStack_1f0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    ((ulong)pbStack_1f0 & 0xffffffff00000000);
      local_1e8._M_dataplus._M_p = (pointer)0x0;
      local_1e8.field_2._8_8_ = 0;
      bVar7 = 1;
      local_1e8.field_2._M_allocated_capacity = local_1e8._M_string_length;
      do {
        bVar4 = cmSystemTools::EnvDiff::ParseOperation((EnvDiff *)local_1f8,envmod);
        bVar7 = bVar7 & bVar4;
        envmod = envmod + 1;
      } while (envmod != pbVar1);
      if (bVar7 == 0) {
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
        ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                     *)local_1f8);
      }
      else {
        cmSystemTools::EnvDiff::ApplyToCurrentEnv((EnvDiff *)local_1f8,(ostringstream *)local_1a8);
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
        ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                     *)local_1f8);
        if (bVar7 != 0) goto LAB_001e4bc3;
      }
      bVar4 = false;
      goto LAB_001e4d2e;
    }
  }
LAB_001e4bc3:
  if (this->UseAllocatedResources == true) {
    local_1f8 = (undefined1  [8])0x0;
    pbStack_1f0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    local_1e8._M_dataplus._M_p = (pointer)0x0;
    SetupResourcesEnvironment
              (this,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_1f8);
    pbVar3 = pbStack_1f0;
    if (local_1f8 != (undefined1  [8])pbStack_1f0) {
      auVar8 = local_1f8;
      do {
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)local_1a8,
                            (((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             auVar8)->_M_dataplus)._M_p,
                            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            auVar8)->_M_string_length);
        std::ios::widen((char)poVar5->_vptr_basic_ostream[-3] + (char)poVar5);
        std::ostream::put((char)poVar5);
        std::ostream::flush();
        auVar8 = (undefined1  [8])((long)auVar8 + 0x20);
      } while (auVar8 != (undefined1  [8])pbVar3);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_1f8);
  }
  else {
    cmSystemTools::UnsetEnv("CTEST_RESOURCE_GROUP_COUNT");
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"#CTEST_RESOURCE_GROUP_COUNT=",0x1c);
    std::ios::widen((char)(ostream *)local_1a8 + (char)*(_func_int **)(local_1a8._0_8_ + -0x18));
    std::ostream::put((char)local_1a8);
    std::ostream::flush();
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=((string *)&(this->TestResult).Environment,(string *)local_1f8);
  if (local_1f8 != (undefined1  [8])&local_1e8) {
    operator_delete((void *)local_1f8,(ulong)(local_1e8._M_dataplus._M_p + 1));
  }
  sVar2 = (this->TestResult).Environment._M_string_length;
  sVar6 = sVar2 - 1;
  if (sVar2 == 0) {
    std::__throw_out_of_range_fmt
              ("%s: __pos (which is %zu) > this->size() (which is %zu)","basic_string::erase");
  }
  (this->TestResult).Environment._M_string_length = sVar6;
  (this->TestResult).Environment._M_dataplus._M_p[sVar6] = '\0';
  bVar4 = cmProcess::StartProcess
                    ((this->TestProcess)._M_t.
                     super___uniq_ptr_impl<cmProcess,_std::default_delete<cmProcess>_>._M_t.
                     super__Tuple_impl<0UL,_cmProcess_*,_std::default_delete<cmProcess>_>.
                     super__Head_base<0UL,_cmProcess_*,_false>._M_head_impl,
                     &this->MultiTestHandler->Loop,affinity);
LAB_001e4d2e:
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
  cmSystemTools::SaveRestoreEnvironment::~SaveRestoreEnvironment(&local_1c0);
  return bVar4;
}

Assistant:

bool cmCTestRunTest::ForkProcess(
  cmDuration testTimeOut, bool explicitTimeout,
  std::vector<std::string>* environment,
  std::vector<std::string>* environment_modification,
  std::vector<size_t>* affinity)
{
  this->TestProcess->SetId(this->Index);
  this->TestProcess->SetWorkingDirectory(this->TestProperties->Directory);
  this->TestProcess->SetCommand(this->ActualCommand);
  this->TestProcess->SetCommandArguments(this->Arguments);

  // determine how much time we have
  cmDuration timeout = this->CTest->GetRemainingTimeAllowed();
  if (timeout != cmCTest::MaxDuration()) {
    timeout -= std::chrono::minutes(2);
  }
  if (this->CTest->GetTimeOut() > cmDuration::zero() &&
      this->CTest->GetTimeOut() < timeout) {
    timeout = this->CTest->GetTimeOut();
  }
  if (testTimeOut > cmDuration::zero() &&
      testTimeOut < this->CTest->GetRemainingTimeAllowed()) {
    timeout = testTimeOut;
  }
  // always have at least 1 second if we got to here
  if (timeout <= cmDuration::zero()) {
    timeout = std::chrono::seconds(1);
  }
  // handle timeout explicitly set to 0
  if (testTimeOut == cmDuration::zero() && explicitTimeout) {
    timeout = cmDuration::zero();
  }
  cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                     this->Index << ": "
                                 << "Test timeout computed to be: "
                                 << cmDurationTo<unsigned int>(timeout)
                                 << "\n",
                     this->TestHandler->GetQuiet());

  this->TestProcess->SetTimeout(timeout);

  cmSystemTools::SaveRestoreEnvironment sre;
  std::ostringstream envMeasurement;

  // We split processing ENVIRONMENT and ENVIRONMENT_MODIFICATION into two
  // phases to ensure that MYVAR=reset: in the latter phase resets to the
  // former phase's settings, rather than to the original environment.
  if (environment && !environment->empty()) {
    cmSystemTools::EnvDiff diff;
    diff.AppendEnv(*environment);
    diff.ApplyToCurrentEnv(&envMeasurement);
  }

  if (environment_modification && !environment_modification->empty()) {
    cmSystemTools::EnvDiff diff;
    bool env_ok = true;

    for (auto const& envmod : *environment_modification) {
      env_ok &= diff.ParseOperation(envmod);
    }

    if (!env_ok) {
      return false;
    }

    diff.ApplyToCurrentEnv(&envMeasurement);
  }

  if (this->UseAllocatedResources) {
    std::vector<std::string> envLog;
    this->SetupResourcesEnvironment(&envLog);
    for (auto const& var : envLog) {
      envMeasurement << var << std::endl;
    }
  } else {
    cmSystemTools::UnsetEnv("CTEST_RESOURCE_GROUP_COUNT");
    // Signify that this variable is being actively unset
    envMeasurement << "#CTEST_RESOURCE_GROUP_COUNT=" << std::endl;
  }

  this->TestResult.Environment = envMeasurement.str();
  // Remove last newline
  this->TestResult.Environment.erase(this->TestResult.Environment.length() -
                                     1);

  return this->TestProcess->StartProcess(this->MultiTestHandler.Loop,
                                         affinity);
}